

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QRect __thiscall QDockAreaLayout::itemRect(QDockAreaLayout *this,QList<int> *path)

{
  int iVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QArrayDataPointer<int> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  QList<int>::mid((QList<int> *)&QStack_38,path,1,-1);
  QVar2 = QDockAreaLayoutInfo::itemRect(this->docks + iVar1,(QList<int> *)&QStack_38);
  QArrayDataPointer<int>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayout::itemRect(const QList<int> &path) const
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    return docks[index].itemRect(path.mid(1));
}